

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_dosetbounds(_glist *x,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int iVar2;
  _widgetbehavior *p_Var3;
  t_displacefn p_Var4;
  t_object *ptVar5;
  t_gobj *x_00;
  float fVar6;
  float fVar7;
  
  iVar1 = x->gl_screeny1;
  iVar2 = x->gl_screeny2;
  if ((iVar1 != y1 || x->gl_screenx1 != x1) || (iVar2 != y2 || x->gl_screenx2 != x2)) {
    x->gl_screenx1 = x1;
    x->gl_screeny1 = y1;
    x->gl_screenx2 = x2;
    x->gl_screeny2 = y2;
    if ((x->field_0xe9 & 3) == 0) {
      if (x->gl_y2 < x->gl_y1) {
        fVar6 = x->gl_y1 - x->gl_y2;
        fVar7 = ((float)(y2 - y1) * fVar6) / (float)x->gl_zoom;
        x->gl_y1 = fVar7;
        x->gl_y2 = fVar7 - fVar6;
        x_00 = x->gl_list;
        if (x_00 != (t_gobj *)0x0) {
          do {
            ptVar5 = pd_checkobject(&x_00->g_pd);
            if (ptVar5 != (t_object *)0x0) {
              p_Var3 = x_00->g_pd->c_wb;
              if ((p_Var3 != (_widgetbehavior *)0x0) &&
                 (p_Var4 = p_Var3->w_displacefn, p_Var4 != (t_displacefn)0x0)) {
                (*p_Var4)(x_00,x,0,(((y2 - y1) - iVar2) + iVar1) / x->gl_zoom);
              }
            }
            x_00 = x_00->g_next;
          } while (x_00 != (_gobj *)0x0);
        }
        canvas_redraw(x);
        return;
      }
    }
  }
  return;
}

Assistant:

static void canvas_dosetbounds(t_canvas *x, int x1, int y1, int x2, int y2)
{
    int heightwas = y2 - y1;
    int heightchange = y2 - y1 - (x->gl_screeny2 - x->gl_screeny1);
    if (x->gl_screenx1 == x1 && x->gl_screeny1 == y1 &&
        x->gl_screenx2 == x2 && x->gl_screeny2 == y2)
            return;
    x->gl_screenx1 = x1;
    x->gl_screeny1 = y1;
    x->gl_screenx2 = x2;
    x->gl_screeny2 = y2;
    if (!glist_isgraph(x) && (x->gl_y2 < x->gl_y1))
    {
            /* if it's flipped so that y grows upward,
            fix so that zero is bottom edge and redraw.  This is
            only appropriate if we're a regular "text" object on the
            parent. */
        t_float diff = x->gl_y1 - x->gl_y2;
        t_gobj *y;
        x->gl_y1 = heightwas * diff/x->gl_zoom;
        x->gl_y2 = x->gl_y1 - diff;
            /* and move text objects accordingly; they should stick
            to the bottom, not the top. */
        for (y = x->gl_list; y; y = y->g_next)
            if (pd_checkobject(&y->g_pd))
                gobj_displace(y, x, 0, heightchange/x->gl_zoom);
        canvas_redraw(x);
    }
}